

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFromCodedStream
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  uint uVar6;
  uint32 uVar7;
  MessageOptions *this_00;
  FileDescriptor *pFVar8;
  string *psVar9;
  Descriptor *pDVar10;
  char *__s;
  ulong uVar11;
  size_type sVar12;
  reference ppFVar13;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int i_00;
  uint i_01;
  uint i_02;
  uint i_03;
  uint i_04;
  uint i_05;
  uint local_2c8;
  uint local_2c4;
  uint32 local_258;
  string local_200;
  string local_1e0;
  string local_1c0;
  uint32 local_1a0;
  uint local_19c;
  uint32 end_tag;
  uint32 start_tag;
  ExtensionRange *range;
  undefined1 local_188 [4];
  int i_3;
  WireType local_164;
  undefined1 local_160 [4];
  WireType wiretype_1;
  WireType local_13c;
  undefined1 local_138 [4];
  WireType wiretype;
  FieldGenerator *local_118;
  FieldGenerator *field_generator;
  FieldDescriptor *local_f0;
  FieldDescriptor *field_2;
  int i_2;
  string local_c0;
  FieldDescriptor *local_a0;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_90;
  int i_1;
  FieldDescriptor *field;
  Descriptor *pDStack_80;
  int i;
  Descriptor *parent;
  undefined4 local_70;
  undefined4 uStack_6c;
  bool capture_last_tag;
  int kCutoff1;
  int kCutoff0;
  uint32 maxtag;
  undefined1 local_30 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  ordered_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  this_00 = Descriptor::options(this->descriptor_);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  if (bVar2) {
    io::Printer::Print((Printer *)
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",&this->classname_);
    io::Printer::Print((Printer *)
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "  return _extensions_.ParseMessageSet(input, internal_default_instance(),\n                                      mutable_unknown_fields());\n"
                       ,"classname",&this->classname_);
    io::Printer::Print((Printer *)
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  }
  else {
    anon_unknown_0::SortFieldsByNumber
              ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_30,this->descriptor_);
    io::Printer::Print((Printer *)
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",&this->classname_);
    if ((this->table_driven_ & 1U) == 0) {
      io::Printer::Print((Printer *)
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure\n  ::google::protobuf::uint32 tag;\n"
                        );
      bVar2 = PreserveUnknownFields(this->descriptor_);
      if (bVar2) {
        pFVar8 = Descriptor::file(this->descriptor_);
        bVar2 = UseUnknownFieldSet(pFVar8,&this->options_);
        if (!bVar2) {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "  ::google::protobuf::io::LazyStringOutputStream unknown_fields_string(\n      ::google::protobuf::NewPermanentCallback(&_internal_metadata_,\n          &::google::protobuf::internal::InternalMetadataWithArenaLite::\n              mutable_unknown_fields));\n  ::google::protobuf::io::CodedOutputStream unknown_fields_stream(\n      &unknown_fields_string, false);\n"
                             ,"classname",&this->classname_);
        }
      }
      ppFVar1 = ordered_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      io::Printer::Print((Printer *)ppFVar1,
                         "  // @@protoc_insertion_point(parse_start:$full_name$)\n","full_name",
                         psVar9);
      io::Printer::Indent((Printer *)
                          ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,"for (;;) {\n");
      io::Printer::Indent((Printer *)
                          ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar3 = Descriptor::field_count(this->descriptor_);
      if (iVar3 == 0) {
        local_258 = 0;
      }
      else {
        iVar3 = Descriptor::field_count(this->descriptor_);
        ppFVar13 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 *)local_30,(long)(iVar3 + -1));
        local_258 = internal::WireFormat::MakeTag(*ppFVar13);
      }
      kCutoff1 = local_258;
      uStack_6c = 0x7f;
      local_70 = 0x3fff;
      parent._7_1_ = 0;
      pDStack_80 = Descriptor::containing_type(this->descriptor_);
      if (pDStack_80 != (Descriptor *)0x0) {
        for (field._4_4_ = 0; iVar3 = field._4_4_, iVar4 = Descriptor::field_count(pDStack_80),
            iVar3 < iVar4; field._4_4_ = field._4_4_ + 1) {
          pFStack_90 = Descriptor::field(pDStack_80,field._4_4_);
          TVar5 = FieldDescriptor::type(pFStack_90);
          if ((TVar5 == TYPE_GROUP) &&
             (pDVar10 = FieldDescriptor::message_type(pFStack_90), pDVar10 == this->descriptor_)) {
            parent._7_1_ = 1;
            break;
          }
        }
      }
      field_1._4_4_ = 0;
      while( true ) {
        iVar3 = field_1._4_4_;
        pFVar8 = Descriptor::file(this->descriptor_);
        iVar4 = FileDescriptor::extension_count(pFVar8);
        uVar6 = extraout_EDX;
        if (iVar4 <= iVar3) break;
        pFVar8 = Descriptor::file(this->descriptor_);
        local_a0 = FileDescriptor::extension(pFVar8,field_1._4_4_);
        TVar5 = FieldDescriptor::type(local_a0);
        if ((TVar5 == TYPE_GROUP) &&
           (pDVar10 = FieldDescriptor::message_type(local_a0), pDVar10 == this->descriptor_)) {
          parent._7_1_ = 1;
          uVar6 = extraout_EDX_00;
          break;
        }
        field_1._4_4_ = field_1._4_4_ + 1;
      }
      ppFVar1 = ordered_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((uint)kCutoff1 < 0x80) {
        local_2c4 = 0x7f;
      }
      else {
        if ((uint)kCutoff1 < 0x4000) {
          local_2c8 = 0x3fff;
        }
        else {
          local_2c8 = kCutoff1;
        }
        local_2c4 = local_2c8;
      }
      SimpleItoa_abi_cxx11_(&local_c0,(protobuf *)(ulong)local_2c4,uVar6);
      __s = "NoLastTag";
      if ((parent._7_1_ & 1) != 0) {
        __s = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i_2,__s,(allocator<char> *)((long)&field_2 + 7));
      io::Printer::Print((Printer *)ppFVar1,
                         "::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoff$lasttag$($max$u);\ntag = p.first;\nif (!p.second) goto handle_unusual;\n"
                         ,"max",&local_c0,"lasttag",(string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
      std::allocator<char>::~allocator((allocator<char> *)((long)&field_2 + 7));
      std::__cxx11::string::~string((string *)&local_c0);
      iVar3 = Descriptor::field_count(this->descriptor_);
      if (0 < iVar3) {
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n"
                          );
        io::Printer::Indent((Printer *)
                            ordered_fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        for (field_2._0_4_ = 0; uVar11 = (ulong)(int)field_2,
            sVar12 = std::
                     vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_30), uVar11 < sVar12; field_2._0_4_ = (int)field_2 + 1) {
          ppFVar13 = std::
                     vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   *)local_30,(long)(int)field_2);
          local_f0 = *ppFVar13;
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Printer *)
                     ordered_fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f0);
          ppFVar1 = ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar6 = FieldDescriptor::number(local_f0);
          SimpleItoa_abi_cxx11_((string *)&field_generator,(protobuf *)(ulong)uVar6,i_00);
          io::Printer::Print((Printer *)ppFVar1,"case $number$: {\n","number",
                             (string *)&field_generator);
          std::__cxx11::string::~string((string *)&field_generator);
          io::Printer::Indent((Printer *)
                              ordered_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_118 = FieldGeneratorMap::get(&this->field_generators_,local_f0);
          ppFVar1 = ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar7 = internal::WireFormat::MakeTag(local_f0);
          SimpleItoa_abi_cxx11_((string *)local_138,(protobuf *)(ulong)uVar7,i_01);
          io::Printer::Print((Printer *)ppFVar1,
                             "if (static_cast< ::google::protobuf::uint8>(tag) ==\n    static_cast< ::google::protobuf::uint8>($commontag$u)) {\n"
                             ,"commontag",(string *)local_138);
          std::__cxx11::string::~string((string *)local_138);
          io::Printer::Indent((Printer *)
                              ordered_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = FieldDescriptor::is_packed(local_f0);
          if (bVar2) {
            (*local_118->_vptr_FieldGenerator[0x14])
                      (local_118,
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            (*local_118->_vptr_FieldGenerator[0x13])
                      (local_118,
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          io::Printer::Outdent
                    ((Printer *)
                     ordered_fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = FieldDescriptor::is_packed(local_f0);
          if (bVar2) {
            TVar5 = FieldDescriptor::type(local_f0);
            local_13c = internal::WireFormat::WireTypeForFieldType(TVar5);
            ppFVar1 = ordered_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = FieldDescriptor::number(local_f0);
            uVar7 = internal::WireFormatLite::MakeTag(iVar3,local_13c);
            SimpleItoa_abi_cxx11_((string *)local_160,(protobuf *)(ulong)uVar7,i_02);
            io::Printer::Print((Printer *)ppFVar1,
                               "} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n"
                               ,"uncommontag",(string *)local_160);
            std::__cxx11::string::~string((string *)local_160);
            io::Printer::Indent((Printer *)
                                ordered_fields.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            (*local_118->_vptr_FieldGenerator[0x13])
                      (local_118,
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            io::Printer::Outdent
                      ((Printer *)
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            bVar2 = FieldDescriptor::is_packable(local_f0);
            if ((bVar2) &&
               (bVar2 = FieldDescriptor::is_packed(local_f0),
               ppFVar1 = ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage, !bVar2)) {
              local_164 = WIRETYPE_LENGTH_DELIMITED;
              iVar3 = FieldDescriptor::number(local_f0);
              uVar7 = internal::WireFormatLite::MakeTag(iVar3,local_164);
              SimpleItoa_abi_cxx11_((string *)local_188,(protobuf *)(ulong)uVar7,i_03);
              io::Printer::Print((Printer *)ppFVar1,
                                 "} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n"
                                 ,"uncommontag",(string *)local_188);
              std::__cxx11::string::~string((string *)local_188);
              io::Printer::Indent((Printer *)
                                  ordered_fields.
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              (*local_118->_vptr_FieldGenerator[0x14])
                        (local_118,
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              io::Printer::Outdent
                        ((Printer *)
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "} else {\n  goto handle_unusual;\n}\n");
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"break;\n");
          io::Printer::Outdent
                    ((Printer *)
                     ordered_fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n\n");
        }
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"default: {\n");
        io::Printer::Indent((Printer *)
                            ordered_fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      io::Printer::Outdent
                ((Printer *)
                 ordered_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,"handle_unusual:\n");
      io::Printer::Indent((Printer *)
                          ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "if (tag == 0 ||\n    ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n  goto success;\n}\n"
                        );
      iVar3 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar3) {
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"if (");
        for (range._4_4_ = 0; iVar3 = range._4_4_,
            iVar4 = Descriptor::extension_range_count(this->descriptor_), iVar3 < iVar4;
            range._4_4_ = range._4_4_ + 1) {
          _end_tag = Descriptor::extension_range(this->descriptor_,range._4_4_);
          if (0 < range._4_4_) {
            io::Printer::Print((Printer *)
                               ordered_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage," ||\n    ");
          }
          local_19c = internal::WireFormatLite::MakeTag(_end_tag->start,WIRETYPE_VARINT);
          local_1a0 = internal::WireFormatLite::MakeTag(_end_tag->end,WIRETYPE_VARINT);
          ppFVar1 = ordered_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (_end_tag->end < 0x20000000) {
            SimpleItoa_abi_cxx11_(&local_1e0,(protobuf *)(ulong)local_19c,i_04);
            SimpleItoa_abi_cxx11_(&local_200,(protobuf *)(ulong)local_1a0,i_05);
            io::Printer::Print((Printer *)ppFVar1,"($start$u <= tag && tag < $end$u)","start",
                               &local_1e0,"end",&local_200);
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&local_1e0);
          }
          else {
            SimpleItoa_abi_cxx11_(&local_1c0,(protobuf *)(ulong)local_19c,i_04);
            io::Printer::Print((Printer *)ppFVar1,"($start$u <= tag)","start",&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
          }
        }
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,") {\n");
        bVar2 = PreserveUnknownFields(this->descriptor_);
        if (bVar2) {
          pFVar8 = Descriptor::file(this->descriptor_);
          bVar2 = UseUnknownFieldSet(pFVar8,&this->options_);
          if (bVar2) {
            io::Printer::Print((Printer *)
                               ordered_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "  DO_(_extensions_.ParseField(tag, input, internal_default_instance(),\n                              mutable_unknown_fields()));\n"
                              );
          }
          else {
            io::Printer::Print((Printer *)
                               ordered_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "  DO_(_extensions_.ParseField(tag, input, internal_default_instance(),\n                              &unknown_fields_stream));\n"
                              );
          }
        }
        else {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "  DO_(_extensions_.ParseField(tag, input, internal_default_instance());\n"
                            );
        }
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"  continue;\n}\n");
      }
      bVar2 = PreserveUnknownFields(this->descriptor_);
      if (bVar2) {
        pFVar8 = Descriptor::file(this->descriptor_);
        bVar2 = UseUnknownFieldSet(pFVar8,&this->options_);
        if (bVar2) {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "DO_(::google::protobuf::internal::WireFormat::SkipField(\n      input, tag, mutable_unknown_fields()));\n"
                            );
        }
        else {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "DO_(::google::protobuf::internal::WireFormatLite::SkipField(\n    input, tag, &unknown_fields_stream));\n"
                            );
        }
      }
      else {
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n"
                          );
      }
      iVar3 = Descriptor::field_count(this->descriptor_);
      if (0 < iVar3) {
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"break;\n");
        io::Printer::Outdent
                  ((Printer *)
                   ordered_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
        io::Printer::Outdent
                  ((Printer *)
                   ordered_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
      }
      io::Printer::Outdent
                ((Printer *)
                 ordered_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Outdent
                ((Printer *)
                 ordered_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppFVar1 = ordered_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      io::Printer::Print((Printer *)ppFVar1,
                         "  }\nsuccess:\n  // @@protoc_insertion_point(parse_success:$full_name$)\n  return true;\nfailure:\n  // @@protoc_insertion_point(parse_failure:$full_name$)\n  return false;\n#undef DO_\n}\n"
                         ,"full_name",psVar9);
      kCutoff0 = 0;
    }
    else {
      io::Printer::Indent((Printer *)
                          ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppFVar1 = ordered_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar8 = Descriptor::file(this->descriptor_);
      psVar9 = FileDescriptor::name_abi_cxx11_(pFVar8);
      FileLevelNamespace((string *)&maxtag,psVar9);
      io::Printer::Print((Printer *)ppFVar1,
                         "return ::google::protobuf::internal::MergePartialFromCodedStream(\n    this,\n    $file_namespace$::TableStruct::schema[\n      $classname$::kIndexInFileMessages],\n    input);\n"
                         ,"classname",&this->classname_,"file_namespace",(string *)&maxtag);
      std::__cxx11::string::~string((string *)&maxtag);
      io::Printer::Outdent
                ((Printer *)
                 ordered_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         ordered_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
      kCutoff0 = 1;
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_30);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "bool $classname$::MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input) {\n",
      "classname", classname_);

    printer->Print(
        "  return _extensions_.ParseMessageSet(input, "
        "internal_default_instance(),\n"
        "                                      mutable_unknown_fields());\n",
        // Vars.
        "classname", classname_);

    printer->Print(
      "}\n");
    return;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print(
    "bool $classname$::MergePartialFromCodedStream(\n"
    "    ::google::protobuf::io::CodedInputStream* input) {\n",
    "classname", classname_);

  if (table_driven_) {
    printer->Indent();

    printer->Print(
        "return ::google::protobuf::internal::MergePartialFromCodedStream(\n"
        "    this,\n"
        "    $file_namespace$::TableStruct::schema[\n"
        "      $classname$::kIndexInFileMessages],\n"
        "    input);\n",
        "classname", classname_,
        "file_namespace", FileLevelNamespace(descriptor_->file()->name()));

    printer->Outdent();

    printer->Print("}\n");
    return;
  }

  printer->Print(
    "#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure\n"
    "  ::google::protobuf::uint32 tag;\n");

  if (PreserveUnknownFields(descriptor_) &&
      !UseUnknownFieldSet(descriptor_->file(), options_)) {
    // Use LazyStringOutputString to avoid initializing unknown fields string
    // unless it is actually needed. For the same reason, disable eager refresh
    // on the CodedOutputStream.
    printer->Print(
      "  ::google::protobuf::io::LazyStringOutputStream unknown_fields_string(\n"
      "      ::google::protobuf::NewPermanentCallback(&_internal_metadata_,\n"
      "          &::google::protobuf::internal::InternalMetadataWithArenaLite::\n"
      "              mutable_unknown_fields));\n"
      "  ::google::protobuf::io::CodedOutputStream unknown_fields_stream(\n"
      "      &unknown_fields_string, false);\n",
      "classname", classname_);
  }

  printer->Print(
    "  // @@protoc_insertion_point(parse_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Indent();
  printer->Print("for (;;) {\n");
  printer->Indent();

  uint32 maxtag = descriptor_->field_count() == 0 ? 0 :
      WireFormat::MakeTag(ordered_fields[descriptor_->field_count() - 1]);
  const int kCutoff0 = 127;               // fits in 1-byte varint
  const int kCutoff1 = (127 << 7) + 127;  // fits in 2-byte varint

  // We need to capture the last tag when parsing if this is a Group type, as
  // our caller will verify (via CodedInputStream::LastTagWas) that the correct
  // closing tag was received.
  bool capture_last_tag = false;
  const Descriptor* parent = descriptor_->containing_type();
  if (parent) {
    for (int i = 0; i < parent->field_count(); i++) {
      const FieldDescriptor* field = parent->field(i);
      if (field->type() == FieldDescriptor::TYPE_GROUP &&
          field->message_type() == descriptor_) {
        capture_last_tag = true;
        break;
      }
    }
  }

  for (int i = 0; i < descriptor_->file()->extension_count(); i++) {
    const FieldDescriptor* field = descriptor_->file()->extension(i);
    if (field->type() == FieldDescriptor::TYPE_GROUP &&
        field->message_type() == descriptor_) {
      capture_last_tag = true;
      break;
    }
  }

  printer->Print("::std::pair< ::google::protobuf::uint32, bool> p = "
                 "input->ReadTagWithCutoff$lasttag$($max$u);\n"
                 "tag = p.first;\n"
                 "if (!p.second) goto handle_unusual;\n",
                 "max", SimpleItoa(maxtag <= kCutoff0 ? kCutoff0 :
                                   (maxtag <= kCutoff1 ? kCutoff1 :
                                    maxtag)),
                 "lasttag", !capture_last_tag ? "NoLastTag" : "");

  if (descriptor_->field_count() > 0) {
    // We don't even want to print the switch() if we have no fields because
    // MSVC dislikes switch() statements that contain only a default value.

    // Note:  If we just switched on the tag rather than the field number, we
    // could avoid the need for the if() to check the wire type at the beginning
    // of each case.  However, this is actually a bit slower in practice as it
    // creates a jump table that is 8x larger and sparser, and meanwhile the
    // if()s are highly predictable.
    //
    // Historically, we inserted checks to peek at the next tag on the wire and
    // jump directly to the next case statement.  While this avoids the jump
    // table that the switch uses, it greatly increases code size (20-60%) and
    // inserts branches that may fail (especially for real world protos that
    // interleave--in field number order--hot and cold fields).  Loadtests
    // confirmed that removing this optimization is performance neutral.
    printer->Print("switch (::google::protobuf::internal::WireFormatLite::"
                   "GetTagFieldNumber(tag)) {\n");

    printer->Indent();

    for (int i = 0; i < ordered_fields.size(); i++) {
      const FieldDescriptor* field = ordered_fields[i];

      PrintFieldComment(printer, field);

      printer->Print(
        "case $number$: {\n",
        "number", SimpleItoa(field->number()));
      printer->Indent();
      const FieldGenerator& field_generator = field_generators_.get(field);

      // Emit code to parse the common, expected case.
      printer->Print("if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                     "    static_cast< ::google::protobuf::uint8>($commontag$u)) {\n",
          "commontag", SimpleItoa(WireFormat::MakeTag(field)));

      printer->Indent();
      if (field->is_packed()) {
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
      } else {
        field_generator.GenerateMergeFromCodedStream(printer);
      }
      printer->Outdent();

      // Emit code to parse unexpectedly packed or unpacked values.
      if (field->is_packed()) {
        internal::WireFormatLite::WireType wiretype =
            WireFormat::WireTypeForFieldType(field->type());
        printer->Print("} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                       "           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n",
                       "uncommontag", SimpleItoa(
                           internal::WireFormatLite::MakeTag(
                               field->number(), wiretype)));
        printer->Indent();
        field_generator.GenerateMergeFromCodedStream(printer);
        printer->Outdent();
      } else if (field->is_packable() && !field->is_packed()) {
        internal::WireFormatLite::WireType wiretype =
            internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
        printer->Print("} else if (static_cast< ::google::protobuf::uint8>(tag) ==\n"
                       "           static_cast< ::google::protobuf::uint8>($uncommontag$u)) {\n",
                       "uncommontag", SimpleItoa(
                           internal::WireFormatLite::MakeTag(
                               field->number(), wiretype)));
        printer->Indent();
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
        printer->Outdent();
      }

      printer->Print(
        "} else {\n"
        "  goto handle_unusual;\n"
        "}\n");

      printer->Print(
        "break;\n");

      printer->Outdent();
      printer->Print("}\n\n");
    }

    printer->Print("default: {\n");
    printer->Indent();
  }

  printer->Outdent();
  printer->Print("handle_unusual:\n");
  printer->Indent();
  // If tag is 0 or an end-group tag then this must be the end of the message.
  printer->Print(
    "if (tag == 0 ||\n"
    "    ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
    "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n"
    "  goto success;\n"
    "}\n");

  // Handle extension ranges.
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (");
    for (int i = 0; i < descriptor_->extension_range_count(); i++) {
      const Descriptor::ExtensionRange* range =
        descriptor_->extension_range(i);
      if (i > 0) printer->Print(" ||\n    ");

      uint32 start_tag = WireFormatLite::MakeTag(
        range->start, static_cast<WireFormatLite::WireType>(0));
      uint32 end_tag = WireFormatLite::MakeTag(
        range->end, static_cast<WireFormatLite::WireType>(0));

      if (range->end > FieldDescriptor::kMaxNumber) {
        printer->Print(
          "($start$u <= tag)",
          "start", SimpleItoa(start_tag));
      } else {
        printer->Print(
          "($start$u <= tag && tag < $end$u)",
          "start", SimpleItoa(start_tag),
          "end", SimpleItoa(end_tag));
      }
    }
    printer->Print(") {\n");
    if (PreserveUnknownFields(descriptor_)) {
      if (UseUnknownFieldSet(descriptor_->file(), options_)) {
        printer->Print(
            "  DO_(_extensions_.ParseField(tag, input, "
            "internal_default_instance(),\n"
            "                              mutable_unknown_fields()));\n");
      } else {
        printer->Print(
            "  DO_(_extensions_.ParseField(tag, input, "
            "internal_default_instance(),\n"
            "                              &unknown_fields_stream));\n");
      }
    } else {
      printer->Print(
          // With static initializers.
          "  DO_(_extensions_.ParseField(tag, input, "
          "internal_default_instance());\n");
    }
    printer->Print(
      "  continue;\n"
      "}\n");
  }

  // We really don't recognize this tag.  Skip it.
  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "DO_(::google::protobuf::internal::WireFormat::SkipField(\n"
        "      input, tag, mutable_unknown_fields()));\n");
    } else {
      printer->Print(
        "DO_(::google::protobuf::internal::WireFormatLite::SkipField(\n"
        "    input, tag, &unknown_fields_stream));\n");
    }
  } else {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n");
  }

  if (descriptor_->field_count() > 0) {
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");    // default:
    printer->Outdent();
    printer->Print("}\n");    // switch
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "  }\n"                   // for (;;)
    "success:\n"
    "  // @@protoc_insertion_point(parse_success:$full_name$)\n"
    "  return true;\n"
    "failure:\n"
    "  // @@protoc_insertion_point(parse_failure:$full_name$)\n"
    "  return false;\n"
    "#undef DO_\n"
    "}\n", "full_name", descriptor_->full_name());
}